

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int hkdf_expand_label(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
                     char *label,ptls_iovec_t hash_value)

{
  ptls_iovec_t info;
  ptls_iovec_t prk;
  size_t sVar1;
  size_t outlen_00;
  int iVar2;
  size_t delta;
  uint8_t *puVar3;
  size_t sVar4;
  size_t sVar5;
  uint8_t hkdf_label_buf [512];
  ptls_buffer_t local_288;
  void *local_268;
  uint8_t *local_260;
  size_t local_258;
  size_t local_250;
  uint8_t *local_248;
  size_t sStack_240;
  uint8_t local_238 [520];
  
  local_288.base = local_238;
  local_288.off = 0;
  local_288.capacity = 0x200;
  local_288.is_allocated = 0;
  local_250 = outlen;
  iVar2 = ptls_buffer_reserve(&local_288,2);
  outlen_00 = local_250;
  puVar3 = local_288.base;
  sVar5 = local_288.off;
  if (iVar2 == 0) {
    *(ushort *)(local_288.base + local_288.off) = (ushort)local_250 << 8 | (ushort)local_250 >> 8;
    local_288.off = local_288.off + 2;
    local_268 = output;
    local_260 = secret.base;
    local_258 = secret.len;
    iVar2 = ptls_buffer_reserve(&local_288,1);
    sVar1 = local_288.off;
    puVar3 = local_288.base;
    sVar5 = local_288.off;
    if (iVar2 == 0) {
      local_288.base[local_288.off] = '\0';
      sVar4 = local_288.off + 1;
      local_288.off = sVar4;
      iVar2 = ptls_buffer_reserve(&local_288,9);
      puVar3 = local_288.base;
      sVar5 = local_288.off;
      if (iVar2 == 0) {
        builtin_memcpy(local_288.base + local_288.off,"TLS 1.3, ",9);
        sVar5 = local_288.off + 9;
        local_288.off = sVar5;
        delta = strlen(label);
        if (delta != 0) {
          iVar2 = ptls_buffer_reserve(&local_288,delta);
          sVar5 = local_288.off;
          puVar3 = local_288.base;
          if (iVar2 != 0) goto LAB_0010db57;
          memcpy(local_288.base + local_288.off,label,delta);
          sVar5 = delta + sVar5;
          local_288.off = sVar5;
        }
        puVar3[sVar1] = (char)sVar5 - (char)sVar4;
        iVar2 = ptls_buffer_reserve(&local_288,1);
        sVar1 = local_288.off;
        puVar3 = local_288.base;
        sVar5 = local_288.off;
        if (iVar2 == 0) {
          local_288.base[local_288.off] = '\0';
          sVar4 = local_288.off + 1;
          sVar5 = sVar4;
          if (hash_value.len != 0) {
            local_288.off = sVar4;
            iVar2 = ptls_buffer_reserve(&local_288,hash_value.len);
            sVar5 = local_288.off;
            puVar3 = local_288.base;
            if (iVar2 != 0) goto LAB_0010db57;
            memcpy(local_288.base + local_288.off,hash_value.base,hash_value.len);
            sVar5 = sVar5 + hash_value.len;
          }
          puVar3[sVar1] = (char)sVar5 - (char)sVar4;
          prk.len = local_258;
          prk.base = local_260;
          info.len = sVar5;
          info.base = puVar3;
          local_288.off = sVar5;
          local_248 = puVar3;
          sStack_240 = sVar5;
          iVar2 = ptls_hkdf_expand(algo,local_268,outlen_00,prk,info);
        }
      }
    }
  }
LAB_0010db57:
  (*ptls_clear_memory)(puVar3,sVar5);
  if (local_288.is_allocated != 0) {
    free(puVar3);
  }
  return iVar2;
}

Assistant:

static int hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                             ptls_iovec_t hash_value)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[512];
    int ret;

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        const char *prefix = "TLS 1.3, ";
        ptls_buffer_pushv(&hkdf_label, prefix, strlen(prefix));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}